

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O2

void media_player2_player_proxy_init(MediaPlayer2PlayerProxy *proxy)

{
  undefined8 uVar1;
  
  proxy->priv = (MediaPlayer2PlayerProxyPrivate *)
                ((long)&(proxy->parent_instance).parent_instance.g_type_instance.g_class +
                (long)MediaPlayer2PlayerProxy_private_offset);
  uVar1 = g_dbus_proxy_get_type();
  uVar1 = g_type_check_instance_cast(proxy,uVar1);
  g_dbus_proxy_set_interface_info(uVar1,&_media_player2_player_interface_info);
  return;
}

Assistant:

static void
media_player2_player_proxy_init (MediaPlayer2PlayerProxy *proxy)
{
#if GLIB_VERSION_MAX_ALLOWED >= GLIB_VERSION_2_38
  proxy->priv = media_player2_player_proxy_get_instance_private (proxy);
#else
  proxy->priv = G_TYPE_INSTANCE_GET_PRIVATE (proxy, TYPE_MEDIA_PLAYER2_PLAYER_PROXY, MediaPlayer2PlayerProxyPrivate);
#endif

  g_dbus_proxy_set_interface_info (G_DBUS_PROXY (proxy), media_player2_player_interface_info ());
}